

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

char * __thiscall
cmOutputConverter::GetRelativeRootPath(cmOutputConverter *this,RelativeRoot relroot)

{
  cmState *pcVar1;
  Directory local_70;
  Directory local_48;
  RelativeRoot local_1c;
  cmOutputConverter *pcStack_18;
  RelativeRoot relroot_local;
  cmOutputConverter *this_local;
  
  local_1c = relroot;
  pcStack_18 = this;
  switch(relroot) {
  case HOME:
    pcVar1 = GetState(this);
    this_local = (cmOutputConverter *)cmState::GetSourceDirectory(pcVar1);
    break;
  case START:
    cmState::Snapshot::GetDirectory(&local_48,&this->StateSnapshot);
    this_local = (cmOutputConverter *)cmState::Directory::GetCurrentSource(&local_48);
    break;
  case HOME_OUTPUT:
    pcVar1 = GetState(this);
    this_local = (cmOutputConverter *)cmState::GetBinaryDirectory(pcVar1);
    break;
  case START_OUTPUT:
    cmState::Snapshot::GetDirectory(&local_70,&this->StateSnapshot);
    this_local = (cmOutputConverter *)cmState::Directory::GetCurrentBinary(&local_70);
    break;
  default:
    this_local = (cmOutputConverter *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char* cmOutputConverter::GetRelativeRootPath(RelativeRoot relroot) const
{
  switch (relroot)
    {
  case HOME:
    return this->GetState()->GetSourceDirectory();
  case START:
    return this->StateSnapshot.GetDirectory().GetCurrentSource();
  case HOME_OUTPUT:
    return this->GetState()->GetBinaryDirectory();
  case START_OUTPUT:
    return this->StateSnapshot.GetDirectory().GetCurrentBinary();
  default: break;
    }
  return 0;
}